

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O0

uint16_t vpatch(dw_rom *rom,uint32_t address,uint32_t size,...)

{
  undefined4 *local_110;
  undefined4 local_f8 [46];
  uint8_t *local_40;
  uint8_t *p;
  va_list arg;
  uint32_t i;
  uint32_t size_local;
  uint32_t address_local;
  dw_rom *rom_local;
  
  arg[0]._0_8_ = &stack0x00000008;
  p._0_4_ = 0x18;
  local_40 = rom->content + address;
  for (arg[0].reg_save_area._4_4_ = 0; arg[0].reg_save_area._4_4_ < size;
      arg[0].reg_save_area._4_4_ = arg[0].reg_save_area._4_4_ + 1) {
    if ((uint)p < 0x29) {
      local_110 = (undefined4 *)((long)local_f8 + (long)(int)(uint)p);
      p._0_4_ = (uint)p + 8;
    }
    else {
      local_110 = (undefined4 *)arg[0]._0_8_;
      arg[0]._0_8_ = arg[0]._0_8_ + 8;
    }
    *local_40 = (uint8_t)*local_110;
    local_40 = local_40 + 1;
  }
  return (short)local_40 - (short)*(undefined4 *)&rom->content;
}

Assistant:

uint16_t vpatch(const dw_rom *rom, const uint32_t address, const uint32_t size,
        ...)
{
    uint32_t i;
    va_list arg;
    uint8_t *p;

    p = &rom->content[address];
    va_start(arg, size);

    for (i=0; i < size; i++) {
        *(p++) = va_arg(arg, int);
    }
    va_end(arg);
    return p - rom->content;
}